

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v6::internal::
       parse_precision<char,fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
                 *handler)

{
  specs_setter<char> *psVar1;
  int precision;
  dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
  *pdVar2;
  specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
  *in_RDX;
  dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
  *in_RSI;
  long in_RDI;
  char c;
  char *in_stack_ffffffffffffffa8;
  dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
  *in_stack_ffffffffffffffb0;
  specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
  *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc8;
  char cVar3;
  precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>_&,_char>
  local_30;
  undefined7 in_stack_ffffffffffffffd8;
  dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
  *local_10;
  
  local_10 = (dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
              *)(in_RDI + 1);
  if (local_10 == in_RSI) {
    cVar3 = '\0';
  }
  else {
    cVar3 = *(char *)&(local_10->super_specs_setter<char>).specs_;
  }
  if ((cVar3 < '0') || ('9' < cVar3)) {
    if (cVar3 != '{') {
      dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
      ::on_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      return (char *)local_10;
    }
    pdVar2 = (dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
              *)(in_RDI + 2);
    local_10 = pdVar2;
    if (pdVar2 != in_RSI) {
      precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>_&,_char>
      ::precision_adapter(&local_30,in_RDX);
      local_10 = (dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
                  *)parse_arg_id<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&,char>>
                              ((char *)in_RSI,(char *)in_RDX,
                               (precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>_&,_char>
                                *)CONCAT17(cVar3,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffb0 = pdVar2;
    }
    if ((local_10 == in_RSI) ||
       (pdVar2 = (dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
                  *)((long)&(local_10->super_specs_setter<char>).specs_ + 1),
       psVar1 = &local_10->super_specs_setter<char>, local_10 = pdVar2,
       *(char *)&psVar1->specs_ != '}')) {
      dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
      ::on_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      return (char *)local_10;
    }
  }
  else {
    precision = parse_nonnegative_int<char,fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&>
                          ((char **)CONCAT17(cVar3,in_stack_ffffffffffffffc8),(char *)in_RDX,
                           in_stack_ffffffffffffffb8);
    specs_setter<char>::on_precision((specs_setter<char> *)in_RDX,precision);
  }
  specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
  ::end_precision((specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
                   *)0x181722);
  return (char *)local_10;
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}